

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
          (string *__return_storage_ptr__,HexEncoder *this,uchar *bytes,int offset,
          size_t len_to_read,size_t len_of_bytes)

{
  HexEncoder HVar1;
  const_reference pvVar2;
  undefined4 in_register_0000000c;
  int local_1bc;
  uint byte;
  int index;
  stringstream ss;
  ostream local_1a8 [376];
  size_t local_30;
  size_t len_of_bytes_local;
  size_t len_to_read_local;
  HexEncoder *pHStack_18;
  int offset_local;
  uchar *bytes_local;
  
  len_of_bytes_local = CONCAT44(in_register_0000000c,offset);
  len_to_read_local._4_4_ = (int)bytes;
  local_30 = len_to_read;
  pHStack_18 = this;
  bytes_local = (uchar *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&byte);
  for (local_1bc = len_to_read_local._4_4_;
      (ulong)(long)local_1bc < (long)len_to_read_local._4_4_ + len_of_bytes_local &&
      (ulong)(long)local_1bc < local_30; local_1bc = local_1bc + 1) {
    HVar1 = pHStack_18[local_1bc];
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)HEX_CHARS,(ulong)((byte)HVar1 >> 4));
    std::operator<<(local_1a8,*pvVar2);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)HEX_CHARS,(ulong)((byte)HVar1 & 0xf))
    ;
    std::operator<<(local_1a8,*pvVar2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&byte);
  return __return_storage_ptr__;
}

Assistant:

std::string HexEncoder::EncodeAsHex(unsigned char* bytes, int offset, size_t len_to_read, size_t len_of_bytes)
{
    std::stringstream ss;

    for (int index = offset; index < offset + len_to_read && index < len_of_bytes; ++index)
    {
        unsigned int byte = (unsigned int) bytes[index];

        ss << HEX_CHARS[byte >> 4u & 0xfu];
        ss << HEX_CHARS[byte & 0xfu];
    }

    return ss.str();
}